

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

void ngram_fwdtree_finish(ngram_search_t *ngs)

{
  double dVar1;
  uint uVar2;
  int w;
  chan_t *h;
  byte bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  chan_t **ppcVar7;
  uint uVar8;
  root_chan_t *h_00;
  int *piVar9;
  
  uVar2 = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,uVar2);
  if (0 < ngs->n_root_chan) {
    h_00 = ngs->root_chan;
    iVar5 = ngs->n_root_chan + 1;
    do {
      hmm_clear(&h_00->hmm);
      h_00 = h_00 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  uVar8 = uVar2 & 1;
  if (0 < ngs->n_active_chan[uVar8]) {
    ppcVar7 = ngs->active_chan_list[uVar8];
    iVar5 = ngs->n_active_chan[uVar8] + 1;
    do {
      h = *ppcVar7;
      ppcVar7 = ppcVar7 + 1;
      hmm_clear(&h->hmm);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  if (0 < ngs->n_active_word[uVar8]) {
    piVar9 = ngs->active_word_list[uVar8];
    iVar5 = ngs->n_active_word[uVar8] + 1;
    do {
      w = *piVar9;
      if (((ngs->base).dict)->word[w].pronlen != 1) {
        bVar3 = (byte)w & 0x1f;
        iVar6 = w + 0x1f;
        if (-1 < w) {
          iVar6 = w;
        }
        ngs->word_active[iVar6 >> 5] =
             ngs->word_active[iVar6 >> 5] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        if (ngs->word_chan[w] != (chan_t *)0x0) {
          ngram_search_free_all_rc(ngs,w);
        }
      }
      piVar9 = piVar9 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  ptmr_stop(&ngs->fwdtree_perf);
  if (0 < (int)uVar2) {
    iVar5 = uVar2 + 1;
    lVar4 = ps_config_int((ngs->base).config,"frate");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x60d,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
            (long)(int)(ngs->bpidx + (uVar2 >> 1)) / (long)iVar5 & 0xffffffff);
    uVar8 = (ngs->st).n_senone_active_utt;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x60f,"%8d senones evaluated (%d/fr)\n",(ulong)uVar8,
            (long)(int)((uVar2 >> 1) + uVar8) / (long)iVar5 & 0xffffffff);
    uVar2 = (ngs->st).n_root_chan_eval;
    uVar8 = (ngs->st).n_nonroot_chan_eval + uVar2;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x613,"%8d channels searched (%d/fr), %d 1st, %d last\n",(ulong)uVar8,
            (long)(int)uVar8 / (long)iVar5 & 0xffffffff,(ulong)uVar2,
            (ulong)(uint)(ngs->st).n_last_chan_eval);
    uVar2 = (ngs->st).n_word_lastchan_eval;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x616,"%8d words for which last channels evaluated (%d/fr)\n",(ulong)uVar2,
            (long)(int)uVar2 / (long)iVar5 & 0xffffffff);
    uVar2 = (ngs->st).n_lastphn_cand_utt;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x618,"%8d candidate words for entering last phone (%d/fr)\n",(ulong)uVar2,
            (long)(int)uVar2 / (long)iVar5 & 0xffffffff);
    dVar1 = (double)(ngs->fwdtree_perf).t_cpu;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x61b,"fwdtree %.2f CPU %.3f xRT\n",dVar1,dVar1 / ((double)iVar5 / (double)lVar4));
    dVar1 = (double)(ngs->fwdtree_perf).t_elapsed;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x61e,"fwdtree %.2f wall %.3f xRT\n",dVar1,dVar1 / ((double)iVar5 / (double)lVar4));
    return;
  }
  return;
}

Assistant:

void
ngram_fwdtree_finish(ngram_search_t *ngs)
{
    int32 i, w, cf, *awl;
    root_chan_t *rhmm;
    chan_t *hmm, **acl;

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    /* Deactivate channels lined up for the next frame */
    /* First, root channels of HMM tree */
    for (i = ngs->n_root_chan, rhmm = ngs->root_chan; i > 0; --i, rhmm++) {
        hmm_clear(&rhmm->hmm);
    }

    /* nonroot channels of HMM tree */
    i = ngs->n_active_chan[cf & 0x1];
    acl = ngs->active_chan_list[cf & 0x1];
    for (hmm = *(acl++); i > 0; --i, hmm = *(acl++)) {
        hmm_clear(&hmm->hmm);
    }

    /* word channels */
    i = ngs->n_active_word[cf & 0x1];
    awl = ngs->active_word_list[cf & 0x1];
    for (w = *(awl++); i > 0; --i, w = *(awl++)) {
        /* Don't accidentally free single-phone words! */
        if (dict_is_single_phone(ps_search_dict(ngs), w))
            continue;
        bitvec_clear(ngs->word_active, w);
        if (ngs->word_chan[w] == NULL)
            continue;
        ngram_search_free_all_rc(ngs, w);
    }

    /*
     * The previous search code did a postprocessing of the
     * backpointer table here, but we will postpone this until it is
     * absolutely necessary, i.e. when generating a word graph.
     * Likewise we don't actually have to decide what the exit word is
     * until somebody requests a backtrace.
     */

    ptmr_stop(&ngs->fwdtree_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr), %d 1st, %d last\n",
               ngs->st.n_root_chan_eval + ngs->st.n_nonroot_chan_eval,
               (ngs->st.n_root_chan_eval + ngs->st.n_nonroot_chan_eval) / (cf + 1),
               ngs->st.n_root_chan_eval, ngs->st.n_last_chan_eval);
        E_INFO("%8d words for which last channels evaluated (%d/fr)\n",
               ngs->st.n_word_lastchan_eval,
               ngs->st.n_word_lastchan_eval / (cf + 1));
        E_INFO("%8d candidate words for entering last phone (%d/fr)\n",
               ngs->st.n_lastphn_cand_utt, ngs->st.n_lastphn_cand_utt / (cf + 1));
        E_INFO("fwdtree %.2f CPU %.3f xRT\n",
               ngs->fwdtree_perf.t_cpu,
               ngs->fwdtree_perf.t_cpu / n_speech);
        E_INFO("fwdtree %.2f wall %.3f xRT\n",
               ngs->fwdtree_perf.t_elapsed,
               ngs->fwdtree_perf.t_elapsed / n_speech);
    }
    /* dump_bptable(ngs); */
}